

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

void stbi__grow_buffer_unsafe(stbi__jpeg *j)

{
  int iVar1;
  byte bVar2;
  stbi_uc sVar3;
  
  do {
    if (j->nomore == 0) {
      bVar2 = stbi__get8(j->s);
      if (bVar2 == 0xff) {
        do {
          sVar3 = stbi__get8(j->s);
        } while (sVar3 == 0xff);
        if (sVar3 != '\0') {
          j->marker = sVar3;
          j->nomore = 1;
          return;
        }
        bVar2 = 0xff;
      }
    }
    else {
      bVar2 = 0;
    }
    iVar1 = j->code_bits;
    j->code_buffer = j->code_buffer | (uint)bVar2 << (0x18U - (char)iVar1 & 0x1f);
    j->code_bits = iVar1 + 8;
    if (0x10 < iVar1) {
      return;
    }
  } while( true );
}

Assistant:

static void stbi__grow_buffer_unsafe(stbi__jpeg *j) {
  do {
    unsigned int b = j->nomore ? 0 : stbi__get8(j->s);
    if (b == 0xff) {
      int c = stbi__get8(j->s);
      while (c == 0xff)
        c = stbi__get8(j->s); // consume fill bytes
      if (c != 0) {
        j->marker = (unsigned char)c;
        j->nomore = 1;
        return;
      }
    }
    j->code_buffer |= b << (24 - j->code_bits);
    j->code_bits += 8;
  } while (j->code_bits <= 24);
}